

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_setenv.cpp
# Opt level: O0

void SetAndGetEnv(int iRoutineID)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  int *piVar4;
  char *pcVar5;
  char *env;
  char local_98 [4];
  int ret;
  char sBuf [128];
  int iRoutineID_local;
  
  printf("routineid %d begin\n",(ulong)(uint)iRoutineID);
  poll((pollfd *)0x0,0,500);
  sprintf(local_98,"cgi_routine_%d",(ulong)(uint)iRoutineID);
  uVar2 = setenv("CGINAME",local_98,1);
  if (uVar2 == 0) {
    printf("routineid %d set env CGINAME %s\n",(ulong)(uint)iRoutineID,local_98);
    poll((pollfd *)0x0,0,500);
    pcVar5 = getenv("CGINAME");
    if (pcVar5 == (char *)0x0) {
      puVar3 = (uint *)__errno_location();
      uVar2 = *puVar3;
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      printf("%s:%d get env err errno %d %s\n","SetAndGetEnv",0x3a,(ulong)uVar2,pcVar5);
    }
    else {
      printf("routineid %d get env CGINAME %s\n",(ulong)(uint)iRoutineID,pcVar5);
    }
  }
  else {
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    printf("%s:%d set env err ret %d errno %d %s\n","SetAndGetEnv",0x2f,(ulong)uVar2,(ulong)uVar1,
           pcVar5);
  }
  return;
}

Assistant:

void SetAndGetEnv(int iRoutineID)
{
	printf("routineid %d begin\n", iRoutineID);

	//use poll as sleep
	poll(NULL, 0, 500);

	char sBuf[128];
	sprintf(sBuf, "cgi_routine_%d", iRoutineID);
	int ret = setenv("CGINAME", sBuf, 1);
	if (ret)
	{
		printf("%s:%d set env err ret %d errno %d %s\n", __func__, __LINE__,
				ret, errno, strerror(errno));
		return;
	}
	printf("routineid %d set env CGINAME %s\n", iRoutineID, sBuf);

	poll(NULL, 0, 500);

	char* env = getenv("CGINAME");
	if (!env)
	{
		printf("%s:%d get env err errno %d %s\n", __func__, __LINE__,
				errno, strerror(errno));
		return;
	}
	printf("routineid %d get env CGINAME %s\n", iRoutineID, env);
}